

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O3

void __thiscall QXmlStreamReaderPrivate::Entity::~Entity(Entity *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->value).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->value).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->name).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> +
         -1);
    UNLOCK();
    if ((__int_type_conflict)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0)
    {
      QArrayData::deallocate(&((this->name).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

Entity(const QString &name, const QString &value)
          :  name(name), value(value), external(false), unparsed(false), literal(false),
             hasBeenParsed(false), isCurrentlyReferenced(false){}